

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * __thiscall luna::String::GetStdString_abi_cxx11_(String *this)

{
  uint uVar1;
  char *pcVar2;
  long in_RSI;
  string *in_RDI;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if (*(char *)(in_RSI + 0x11) == '\0') {
    uVar1 = *(uint *)(in_RSI + 0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,(char *)(in_RSI + 0x18),(ulong)uVar1,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    pcVar2 = *(char **)(in_RSI + 0x18);
    uVar1 = *(uint *)(in_RSI + 0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar2,(ulong)uVar1,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string String::GetStdString() const
    {
        if (in_heap_)
            return std::string(str_, length_);
        else
            return std::string(str_buffer_, length_);
    }